

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O3

void __thiscall
testing::StrictMock<solitaire::events::EventsSourceMock>::StrictMock
          (StrictMock<solitaire::events::EventsSourceMock> *this)

{
  Mock::FailUninterestingCalls(this);
  (this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
           untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
           untyped_on_call_specs_.super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
           untyped_on_call_specs_.super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.name_ =
       (char *)0x0;
  (this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
  untyped_on_call_specs_.super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  (this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.mock_obj_ =
       (void *)0x0;
  *(pointer *)
   ((long)&(this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
           untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_EventsSourceMock).super_EventsSource._vptr_EventsSource =
       (_func_int **)&PTR__EventsSourceMock_00322540;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&(this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase);
  (this->super_EventsSourceMock).gmock10_getEvent_10.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMocker_00322568;
  (this->super_EventsSourceMock).super_EventsSource._vptr_EventsSource =
       (_func_int **)&PTR__StrictMock_003224a8;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }